

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_physfs.c
# Opt level: O0

int cmd_crc32(char *args)

{
  size_t sVar1;
  long lVar2;
  undefined8 uVar3;
  long lVar4;
  uint uVar5;
  uint local_240;
  uint local_23c;
  PHYSFS_uint32 bit;
  PHYSFS_uint32 i;
  PHYSFS_sint64 bytesread;
  byte local_228 [4];
  PHYSFS_uint32 crc;
  PHYSFS_uint8 buffer [512];
  PHYSFS_File *f;
  char *args_local;
  
  f = (PHYSFS_File *)args;
  if (*args == '\"') {
    f = (PHYSFS_File *)(args + 1);
    sVar1 = strlen((char *)f);
    *(char *)((long)f + (sVar1 - 1)) = '\0';
  }
  lVar2 = PHYSFS_openRead(f);
  if (lVar2 == 0) {
    uVar3 = PHYSFS_getLastError();
    printf("failed to open. Reason: [%s].\n",uVar3);
  }
  else {
    bytesread._4_4_ = 0xffffffff;
    while (lVar4 = PHYSFS_readBytes(lVar2,local_228,0x200), 0 < lVar4) {
      for (local_23c = 0; (long)(ulong)local_23c < lVar4; local_23c = local_23c + 1) {
        local_240 = 0;
        while (local_240 < 8) {
          uVar5 = 0;
          if (((bytesread._4_4_ ^ local_228[local_23c]) & 1) != 0) {
            uVar5 = 0xedb88320;
          }
          bytesread._4_4_ = bytesread._4_4_ >> 1 ^ uVar5;
          local_240 = local_240 + 1;
          local_228[local_23c] = (byte)((int)(uint)local_228[local_23c] >> 1);
        }
      }
    }
    if (lVar4 < 0) {
      uVar3 = PHYSFS_getLastError();
      printf("error while reading. Reason: [%s].\n",uVar3);
    }
    else {
      PHYSFS_close(lVar2);
      printf("CRC32 for %s: 0x%08X\n",f,(ulong)(bytesread._4_4_ ^ 0xffffffff));
    }
  }
  return 1;
}

Assistant:

static int cmd_crc32(char *args)
{
    PHYSFS_File *f;

    if (*args == '\"')
    {
        args++;
        args[strlen(args) - 1] = '\0';
    } /* if */

    f = PHYSFS_openRead(args);
    if (f == NULL)
        printf("failed to open. Reason: [%s].\n", PHYSFS_getLastError());
    else
    {
        PHYSFS_uint8 buffer[CRC32_BUFFERSIZE];
        PHYSFS_uint32 crc = -1;
        PHYSFS_sint64 bytesread;

        while ((bytesread = PHYSFS_readBytes(f, buffer, CRC32_BUFFERSIZE)) > 0)
        {
            PHYSFS_uint32 i, bit;
            for (i = 0; i < bytesread; i++)
            {
                for (bit = 0; bit < 8; bit++, buffer[i] >>= 1)
                    crc = (crc >> 1) ^ (((crc ^ buffer[i]) & 1) ? 0xEDB88320 : 0);
            } /* for */
        } /* while */

        if (bytesread < 0)
        {
            printf("error while reading. Reason: [%s].\n",
                   PHYSFS_getLastError());
            return 1;
        } /* if */

        PHYSFS_close(f);

        crc ^= -1;
        printf("CRC32 for %s: 0x%08X\n", args, crc);
    } /* else */

    return 1;
}